

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

double __thiscall
sector_t::NextLowestFloorAt
          (sector_t *this,double x,double y,double z,int flags,double steph,sector_t **resultsec,
          F3DFloor **resultffloor)

{
  F3DFloor *pFVar1;
  bool bVar2;
  uint uVar3;
  F3DFloor **ppFVar4;
  double dVar5;
  double dVar6;
  undefined1 local_a0 [8];
  DVector2 pos;
  double ffb;
  double ffz;
  F3DFloor *ff;
  uint i;
  double realfloor;
  double dStack_60;
  uint numff;
  double planeheight;
  sector_t *sec;
  F3DFloor **resultffloor_local;
  sector_t **resultsec_local;
  double steph_local;
  int flags_local;
  double z_local;
  double y_local;
  double x_local;
  sector_t *this_local;
  
  dStack_60 = 3.4028234663852886e+38;
  planeheight = (double)this;
  z_local = y;
  y_local = x;
  do {
    uVar3 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                      ((TArray<F3DFloor_*,_F3DFloor_*> *)
                       (*(long *)((long)planeheight + 0x200) + 0x70));
    dVar5 = secplane_t::ZatPoint((secplane_t *)((long)planeheight + 0xb0),y_local,z_local);
    for (ff._4_4_ = 0; ff._4_4_ < uVar3; ff._4_4_ = ff._4_4_ + 1) {
      ppFVar4 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)
                           (*(long *)((long)planeheight + 0x200) + 0x70),(ulong)ff._4_4_);
      pFVar1 = *ppFVar4;
      if ((pFVar1->flags & 3) == 3) {
        dVar6 = secplane_t::ZatPoint((pFVar1->top).plane,y_local,z_local);
        pos.Y = secplane_t::ZatPoint((pFVar1->bottom).plane,y_local,z_local);
        if ((dVar5 < dVar6) &&
           ((dVar6 <= z || ((((flags & 8U) == 0 && (pos.Y < z)) && (dVar6 < z + steph)))))) {
          if (resultsec != (sector_t **)0x0) {
            *resultsec = (sector_t *)planeheight;
          }
          if (resultffloor == (F3DFloor **)0x0) {
            return dVar6;
          }
          *resultffloor = pFVar1;
          return dVar6;
        }
      }
    }
    if ((((flags & 0x10U) != 0) || (bVar2 = PortalBlocksMovement((sector_t *)planeheight,0), bVar2))
       || (dVar6 = GetPortalPlaneZ((sector_t *)planeheight,0), dStack_60 <= dVar6)) {
      if (resultffloor != (F3DFloor **)0x0) {
        *resultffloor = (F3DFloor *)0x0;
      }
      if (resultsec != (sector_t **)0x0) {
        *resultsec = (sector_t *)planeheight;
      }
      return dVar5;
    }
    GetPortalDisplacement((sector_t *)local_a0,SUB84(planeheight,0));
    y_local = (double)local_a0 + y_local;
    z_local = pos.X + z_local;
    dStack_60 = GetPortalPlaneZ((sector_t *)planeheight,0);
    planeheight = (double)P_PointInSector(y_local,z_local);
  } while( true );
}

Assistant:

double sector_t::NextLowestFloorAt(double x, double y, double z, int flags, double steph, sector_t **resultsec, F3DFloor **resultffloor)
{
	sector_t *sec = this;
	double planeheight = FLT_MAX;
	while (true)
	{
		// Looking through planes from top to bottom
		unsigned numff = sec->e->XFloor.ffloors.Size();
		double realfloor = sec->floorplane.ZatPoint(x, y);
		for (unsigned i = 0; i < numff; ++i)
		{
			F3DFloor *ff = sec->e->XFloor.ffloors[i];


			// either with feet above the 3D floor or feet with less than 'stepheight' map units inside
			if ((ff->flags & (FF_EXISTS | FF_SOLID)) == (FF_EXISTS | FF_SOLID))
			{
				double ffz = ff->top.plane->ZatPoint(x, y);
				double ffb = ff->bottom.plane->ZatPoint(x, y);

				if (ffz > realfloor && (z >= ffz || (!(flags & FFCF_3DRESTRICT) && (ffb < z && ffz < z + steph))))
				{ // This floor is beneath our feet.
					if (resultsec) *resultsec = sec;
					if (resultffloor) *resultffloor = ff;
					return ffz;
				}
			}
		}
		if ((flags & FFCF_NOPORTALS) || sec->PortalBlocksMovement(sector_t::floor) || planeheight <= sec->GetPortalPlaneZ(floor))
		{ // Use sector's floor
			if (resultffloor) *resultffloor = NULL;
			if (resultsec) *resultsec = sec;
			return realfloor;
		}
		else
		{
			DVector2 pos = sec->GetPortalDisplacement(floor);
			x += pos.X;
			y += pos.Y;
			planeheight = sec->GetPortalPlaneZ(floor);
			sec = P_PointInSector(x, y);
		}
	}
}